

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void __thiscall asmjit::ConstPool::fill(ConstPool *this,void *dst)

{
  Node *pNVar1;
  Node *pNVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  bool bVar5;
  long alStack_250 [68];
  
  lVar3 = 0;
  memset(dst,0,this->_size);
  __n = 1;
  do {
    pNVar2 = this->_tree[lVar3]._root;
    if (pNVar2 != (Node *)0x0) {
      lVar4 = 0;
      do {
        pNVar1 = pNVar2->_link[0];
        if (pNVar1 == (Node *)0x0) {
          while( true ) {
            if (-1 < *(int *)&pNVar2->field_0x10) {
              memcpy((void *)((ulong)pNVar2->_offset + (long)dst),pNVar2 + 1,__n);
            }
            pNVar1 = pNVar2->_link[1];
            bVar5 = pNVar1 != (Node *)0x0;
            if (bVar5) goto LAB_0015c004;
            if (lVar4 == 0) break;
            pNVar2 = (Node *)alStack_250[lVar4 + 2];
            lVar4 = lVar4 + -1;
          }
          lVar4 = 0;
          pNVar1 = (Node *)0x0;
        }
        else {
          if (lVar4 == 0x40) {
            fill();
          }
          alStack_250[lVar4 + 3] = (long)pNVar2;
          lVar4 = lVar4 + 1;
          bVar5 = true;
        }
LAB_0015c004:
        pNVar2 = pNVar1;
      } while (bVar5);
    }
    __n = __n * 2;
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  ::memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].iterate(filler);
    filler._dataSize <<= 1;
  }
}